

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_compilation.cpp
# Opt level: O0

ostream_base * pstore::repo::operator<<(ostream_base *os,visibility v)

{
  visibility v_local;
  ostream_base *os_local;
  
  if (v == default_vis) {
    os_local = exchange::export_ns::operator<<(os,"default");
  }
  else if (v == hidden_vis) {
    os_local = exchange::export_ns::operator<<(os,"hidden");
  }
  else if (v == protected_vis) {
    os_local = exchange::export_ns::operator<<(os,"protected");
  }
  else {
    os_local = exchange::export_ns::operator<<(os,"unknown");
  }
  return os_local;
}

Assistant:

ostream_base & operator<< (ostream_base & os, visibility const v) {
            switch (v) {
            case repo::visibility::default_vis: return os << "default";
            case repo::visibility::hidden_vis: return os << "hidden";
            case repo::visibility::protected_vis: return os << "protected";
            }
            return os << "unknown";
        }